

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_engine.cpp
# Opt level: O3

void __thiscall zmq::udp_engine_t::restart_output(udp_engine_t *this)

{
  restart_output((udp_engine_t *)(this[-1]._in_buffer + 0x1ff4));
  return;
}

Assistant:

void zmq::udp_engine_t::restart_output ()
{
    //  If we don't support send we just drop all messages
    if (!_send_enabled) {
        msg_t msg;
        while (_session->pull_msg (&msg) == 0)
            msg.close ();
    } else {
        set_pollout (_handle);
        out_event ();
    }
}